

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

int has_ext(char *ext)

{
  byte *__haystack;
  int iVar1;
  GLubyte *pGVar2;
  byte *__haystack_00;
  byte *pbVar3;
  size_t sVar4;
  GLuint GVar5;
  uint uVar6;
  bool bVar7;
  GLint num_exts;
  int local_2c;
  
  if ((GLVersion.major < 3) || (glad_glGetStringi == (PFNGLGETSTRINGIPROC)0x0)) {
    __haystack_00 = (*glad_glGetString)(0x1f03);
    uVar6 = 0;
    if ((ext != (char *)0x0 && __haystack_00 != (byte *)0x0) &&
       (pbVar3 = (byte *)strstr((char *)__haystack_00,ext), pbVar3 != (byte *)0x0)) {
      sVar4 = strlen(ext);
      do {
        __haystack = pbVar3 + sVar4;
        if (((pbVar3 == __haystack_00) || (pbVar3[-1] == 0x20)) && ((*__haystack & 0xdf) == 0)) {
          return 1;
        }
        pbVar3 = (byte *)strstr((char *)__haystack,ext);
        __haystack_00 = __haystack;
      } while (pbVar3 != (byte *)0x0);
    }
  }
  else {
    (*glad_glGetIntegerv)(0x821d,&local_2c);
    bVar7 = 0 < local_2c;
    if (0 < local_2c) {
      pGVar2 = (*glad_glGetStringi)(0x1f03,0);
      iVar1 = strcmp((char *)pGVar2,ext);
      if (iVar1 != 0) {
        GVar5 = 1;
        do {
          bVar7 = (int)GVar5 < local_2c;
          if (local_2c <= (int)GVar5) break;
          pGVar2 = (*glad_glGetStringi)(0x1f03,GVar5);
          iVar1 = strcmp((char *)pGVar2,ext);
          GVar5 = GVar5 + 1;
        } while (iVar1 != 0);
      }
    }
    uVar6 = (uint)bVar7;
  }
  return uVar6;
}

Assistant:

static int has_ext(const char *ext) {
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    if(GLVersion.major < 3 || glGetStringi == NULL) {
#endif
        const char *extensions;
        const char *loc;
        const char *terminator;
        extensions = (const char*) glGetString(GL_EXTENSIONS);
        if(extensions == NULL || ext == NULL) {
            return 0;
        }

        while(1) {
            loc = strstr(extensions, ext);
            if(loc == NULL) {
                return 0;
            }

            terminator = loc + strlen(ext);
            if((loc == extensions || *(loc - 1) == ' ') &&
                (*terminator == ' ' || *terminator == '\0')) {
                return 1;
            }
            extensions = terminator;
        }
#if defined(GL_VERSION_3_0) || defined(GL_ES_VERSION_3_0)
    } else {
        GLint num_exts, index;

        glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
        for(index = 0; index < num_exts; index++) {
            if(strcmp((const char*) glGetStringi(GL_EXTENSIONS, index), ext) == 0) {
                return 1;
            }
        }
    }
#endif

    return 0;
}